

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringAtoRealMethod::~StringAtoRealMethod(StringAtoRealMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringAtoRealMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::AToReal, SubroutineKind::Function, 0, {},
                               builtins.realType, true) {}